

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O0

int32_t __thiscall
aeron::concurrent::logbuffer::TermAppender::appendFragmentedMessage
          (TermAppender *this,HeaderWriter *header,AtomicBuffer *srcBuffer,index_t srcOffset,
          index_t length,index_t maxPayloadLength,
          on_reserved_value_supplier_t *reservedValueSupplier,int32_t activeTermId)

{
  int length_00;
  int32_t iVar1;
  uint value;
  int iVar2;
  int *piVar3;
  long v;
  int local_8c;
  int64_t reservedValue;
  index_t alignedLength;
  index_t frameLength;
  index_t bytesToWrite;
  int32_t frameOffset;
  index_t remaining;
  uint8_t flags;
  int64_t resultingOffset;
  int32_t termLength;
  int32_t termId;
  int64_t termOffset;
  int64_t rawTail;
  int local_38;
  index_t requiredLength;
  index_t lastFrameLength;
  index_t remainingPayload;
  int numMaxPayloads;
  index_t maxPayloadLength_local;
  index_t length_local;
  index_t srcOffset_local;
  AtomicBuffer *srcBuffer_local;
  HeaderWriter *header_local;
  TermAppender *this_local;
  
  lastFrameLength = length / maxPayloadLength;
  requiredLength = length % maxPayloadLength;
  remainingPayload = maxPayloadLength;
  numMaxPayloads = length;
  maxPayloadLength_local = srcOffset;
  _length_local = srcBuffer;
  srcBuffer_local = (AtomicBuffer *)header;
  header_local = (HeaderWriter *)this;
  if (requiredLength < 1) {
    local_8c = 0;
  }
  else {
    local_8c = util::BitUtil::align<int>(requiredLength + 0x20,0x20);
  }
  local_38 = local_8c;
  rawTail._4_4_ = lastFrameLength * (remainingPayload + 0x20) + local_8c;
  termOffset = getAndAddRawTail(this,rawTail._4_4_);
  _termLength = termOffset & 0xffffffff;
  resultingOffset._4_4_ = LogBufferDescriptor::termId(termOffset);
  resultingOffset._0_4_ = AtomicBuffer::capacity(this->m_termBuffer);
  checkTerm(activeTermId,resultingOffset._4_4_);
  _remaining = _termLength + (long)rawTail._4_4_;
  if ((index_t)resultingOffset < _remaining) {
    iVar1 = handleEndOfLogCondition
                      (this->m_termBuffer,_termLength,(HeaderWriter *)srcBuffer_local,
                       (index_t)resultingOffset,resultingOffset._4_4_);
    _remaining = (long)iVar1;
  }
  else {
    frameOffset._3_1_ = 0x80;
    bytesToWrite = numMaxPayloads;
    frameLength = (index_t)_termLength;
    do {
      piVar3 = std::min<int>(&bytesToWrite,&remainingPayload);
      length_00 = *piVar3;
      value = length_00 + 0x20;
      iVar2 = util::BitUtil::align<int>(value,0x20);
      HeaderWriter::write((HeaderWriter *)srcBuffer_local,(int)this->m_termBuffer,
                          (void *)(ulong)(uint)frameLength,(ulong)value);
      AtomicBuffer::putBytes
                (this->m_termBuffer,frameLength + 0x20,_length_local,
                 maxPayloadLength_local + (numMaxPayloads - bytesToWrite),length_00);
      if (bytesToWrite <= remainingPayload) {
        frameOffset._3_1_ = frameOffset._3_1_ | 0x40;
      }
      FrameDescriptor::frameFlags(this->m_termBuffer,frameLength,frameOffset._3_1_);
      v = std::function<long_(aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
                    (reservedValueSupplier,this->m_termBuffer,frameLength,value);
      AtomicBuffer::putInt64(this->m_termBuffer,frameLength + 0x18,v);
      FrameDescriptor::frameLengthOrdered(this->m_termBuffer,frameLength,value);
      frameOffset._3_1_ = 0;
      frameLength = iVar2 + frameLength;
      bytesToWrite = bytesToWrite - length_00;
    } while (0 < bytesToWrite);
  }
  return (int32_t)_remaining;
}

Assistant:

std::int32_t appendFragmentedMessage(
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        util::index_t maxPayloadLength,
        const on_reserved_value_supplier_t& reservedValueSupplier,
        std::int32_t activeTermId)
    {
        const int numMaxPayloads = length / maxPayloadLength;
        const util::index_t remainingPayload = length % maxPayloadLength;
        const util::index_t lastFrameLength = (remainingPayload > 0) ?
            util::BitUtil::align(remainingPayload + DataFrameHeader::LENGTH, FrameDescriptor::FRAME_ALIGNMENT) : 0;
        const util::index_t requiredLength =
            (numMaxPayloads * (maxPayloadLength + DataFrameHeader::LENGTH)) + lastFrameLength;
        const std::int64_t rawTail = getAndAddRawTail(requiredLength);
        const std::int64_t termOffset = rawTail & 0xFFFFFFFF;
        const std::int32_t termId = LogBufferDescriptor::termId(rawTail);

        const std::int32_t termLength = m_termBuffer.capacity();

        checkTerm(activeTermId, termId);

        std::int64_t resultingOffset = termOffset + requiredLength;
        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termOffset, header, termLength, termId);
        }
        else
        {
            std::uint8_t flags = FrameDescriptor::BEGIN_FRAG;
            util::index_t remaining = length;
            std::int32_t frameOffset = static_cast<std::int32_t>(termOffset);

            do
            {
                const util::index_t bytesToWrite = std::min(remaining, maxPayloadLength);
                const util::index_t frameLength = bytesToWrite + DataFrameHeader::LENGTH;
                const util::index_t alignedLength =
                    util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

                header.write(m_termBuffer, frameOffset, frameLength, termId);
                m_termBuffer.putBytes(
                    frameOffset + DataFrameHeader::LENGTH,
                    srcBuffer,
                    srcOffset + (length - remaining),
                    bytesToWrite);

                if (remaining <= maxPayloadLength)
                {
                    flags |= FrameDescriptor::END_FRAG;
                }

                FrameDescriptor::frameFlags(m_termBuffer, frameOffset, flags);

                const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, frameOffset, frameLength);
                m_termBuffer.putInt64(frameOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

                FrameDescriptor::frameLengthOrdered(m_termBuffer, frameOffset, frameLength);

                flags = 0;
                frameOffset += alignedLength;
                remaining -= bytesToWrite;
            }
            while (remaining > 0);
        }

        return static_cast<std::int32_t>(resultingOffset);
    }